

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::reflection_ssbo_instance_name_is_significant(Compiler *this)

{
  uint id;
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  SPIRVariable *pSVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  long lVar7;
  byte bVar8;
  uint32_t local_84;
  ParsedIR *local_80;
  LoopLock local_78;
  TypedID<(spirv_cross::Types)0> *local_70;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ssbo_type_ids;
  
  if ((this->ir).source.known == true) {
    bVar8 = (this->ir).source.hlsl;
  }
  else {
    local_80 = &this->ir;
    ssbo_type_ids._M_h._M_buckets = &ssbo_type_ids._M_h._M_single_bucket;
    ssbo_type_ids._M_h._M_bucket_count = 1;
    ssbo_type_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ssbo_type_ids._M_h._M_element_count = 0;
    ssbo_type_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    ssbo_type_ids._M_h._M_rehash_policy._M_next_resize = 0;
    ssbo_type_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ParsedIR::create_loop_hard_lock(local_80);
    local_70 = (this->ir).ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    sVar1 = (this->ir).ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    bVar8 = 0;
    for (lVar7 = 0; sVar1 << 2 != lVar7; lVar7 = lVar7 + 4) {
      id = *(uint *)((long)&local_70->id + lVar7);
      bVar2 = bVar8;
      if ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].type == TypeVariable) {
        pSVar4 = ParsedIR::get<spirv_cross::SPIRVariable>(local_80,id);
        pSVar5 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(pSVar4->super_IVariant).field_0xc);
        if ((pSVar5->pointer == true) &&
           ((pSVar4->storage == StorageClassStorageBuffer ||
            ((pSVar4->storage == StorageClassUniform &&
             (bVar3 = ParsedIR::has_decoration
                                (local_80,(ID)(pSVar5->super_IVariant).self.id,DecorationBufferBlock
                                ), bVar3)))))) {
          local_84 = (pSVar5->super_IVariant).self.id;
          sVar6 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&ssbo_type_ids._M_h,&local_84);
          bVar2 = 1;
          if (sVar6 == 0) {
            local_84 = (pSVar5->super_IVariant).self.id;
            ::std::__detail::
            _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&ssbo_type_ids,&local_84);
            bVar2 = bVar8;
          }
        }
      }
      bVar8 = bVar2;
    }
    ParsedIR::LoopLock::~LoopLock(&local_78);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&ssbo_type_ids._M_h);
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool Compiler::reflection_ssbo_instance_name_is_significant() const
{
	if (ir.source.known)
	{
		// UAVs from HLSL source tend to be declared in a way where the type is reused
		// but the instance name is significant, and that's the name we should report.
		// For GLSL, SSBOs each have their own block type as that's how GLSL is written.
		return ir.source.hlsl;
	}

	unordered_set<uint32_t> ssbo_type_ids;
	bool aliased_ssbo_types = false;

	// If we don't have any OpSource information, we need to perform some shaky heuristics.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (!type.pointer || var.storage == StorageClassFunction)
			return;

		bool ssbo = var.storage == StorageClassStorageBuffer ||
		            (var.storage == StorageClassUniform && has_decoration(type.self, DecorationBufferBlock));

		if (ssbo)
		{
			if (ssbo_type_ids.count(type.self))
				aliased_ssbo_types = true;
			else
				ssbo_type_ids.insert(type.self);
		}
	});

	// If the block name is aliased, assume we have HLSL-style UAV declarations.
	return aliased_ssbo_types;
}